

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptor::CopyTo(FileDescriptor *this,FileDescriptorProto *proto)

{
  FileDescriptorProto *this_00;
  int iVar1;
  int iVar2;
  FileDescriptor *this_01;
  Descriptor *this_02;
  DescriptorProto *proto_00;
  EnumDescriptor *this_03;
  EnumDescriptorProto *proto_01;
  ServiceDescriptor *this_04;
  ServiceDescriptorProto *proto_02;
  FieldDescriptor *this_05;
  FieldDescriptorProto *proto_03;
  int local_48;
  int local_44;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int local_1c;
  FileDescriptorProto *pFStack_18;
  int i;
  FileDescriptorProto *proto_local;
  FileDescriptor *this_local;
  
  pFStack_18 = proto;
  proto_local = (FileDescriptorProto *)this;
  CopyHeadingTo(this,proto);
  local_1c = 0;
  while( true ) {
    iVar2 = local_1c;
    iVar1 = dependency_count(this);
    this_00 = pFStack_18;
    if (iVar1 <= iVar2) break;
    this_01 = dependency(this,local_1c);
    _i_2 = name(this_01);
    FileDescriptorProto::add_dependency<std::basic_string_view<char,std::char_traits<char>>>
              (this_00,(basic_string_view<char,_std::char_traits<char>_> *)&i_2);
    local_1c = local_1c + 1;
  }
  i_3 = 0;
  while( true ) {
    iVar2 = public_dependency_count(this);
    if (iVar2 <= i_3) break;
    FileDescriptorProto::add_public_dependency(pFStack_18,this->public_dependencies_[i_3]);
    i_3 = i_3 + 1;
  }
  i_4 = 0;
  while( true ) {
    iVar2 = weak_dependency_count(this);
    if (iVar2 <= i_4) break;
    FileDescriptorProto::add_weak_dependency(pFStack_18,this->weak_dependencies_[i_4]);
    i_4 = i_4 + 1;
  }
  i_5 = 0;
  while( true ) {
    iVar2 = message_type_count(this);
    if (iVar2 <= i_5) break;
    this_02 = message_type(this,i_5);
    proto_00 = FileDescriptorProto::add_message_type(pFStack_18);
    Descriptor::CopyTo(this_02,proto_00);
    i_5 = i_5 + 1;
  }
  i_6 = 0;
  while( true ) {
    iVar2 = enum_type_count(this);
    if (iVar2 <= i_6) break;
    this_03 = enum_type(this,i_6);
    proto_01 = FileDescriptorProto::add_enum_type(pFStack_18);
    EnumDescriptor::CopyTo(this_03,proto_01);
    i_6 = i_6 + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar2 = service_count(this);
    if (iVar2 <= local_44) break;
    this_04 = service(this,local_44);
    proto_02 = FileDescriptorProto::add_service(pFStack_18);
    ServiceDescriptor::CopyTo(this_04,proto_02);
    local_44 = local_44 + 1;
  }
  local_48 = 0;
  while( true ) {
    iVar2 = extension_count(this);
    if (iVar2 <= local_48) break;
    this_05 = extension(this,local_48);
    proto_03 = FileDescriptorProto::add_extension(pFStack_18);
    FieldDescriptor::CopyTo(this_05,proto_03);
    local_48 = local_48 + 1;
  }
  return;
}

Assistant:

void FileDescriptor::CopyTo(FileDescriptorProto* proto) const {
  CopyHeadingTo(proto);

  for (int i = 0; i < dependency_count(); i++) {
    proto->add_dependency(dependency(i)->name());
  }

  for (int i = 0; i < public_dependency_count(); i++) {
    proto->add_public_dependency(public_dependencies_[i]);
  }

  for (int i = 0; i < weak_dependency_count(); i++) {
    proto->add_weak_dependency(weak_dependencies_[i]);
  }

  for (int i = 0; i < message_type_count(); i++) {
    message_type(i)->CopyTo(proto->add_message_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < service_count(); i++) {
    service(i)->CopyTo(proto->add_service());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }
}